

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderRead(xmlTextReaderPtr reader)

{
  xmlParserCtxtPtr pxVar1;
  xmlChar *pxVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  xmlElementType xVar6;
  int iVar7;
  xmlNodePtr pxVar8;
  xmlXIncludeCtxtPtr ctxt;
  xmlNodePtr pxVar9;
  _xmlNode *p_Var10;
  xmlTextReaderState xVar11;
  _xmlNode *p_Var12;
  xmlNodePtr pxVar13;
  xmlNodePtr tmp;
  long lVar14;
  xmlNodePtr local_40;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  reader->curnode = (xmlNodePtr)0x0;
  if (reader->doc != (xmlDocPtr)0x0) {
    xVar11 = reader->state;
    if (xVar11 == XML_TEXTREADER_END) {
      return 0;
    }
    p_Var10 = reader->node;
    do {
      if (p_Var10 == (_xmlNode *)0x0) {
        p_Var10 = reader->doc->children;
        if (p_Var10 == (_xmlNode *)0x0) goto LAB_0019a7cd;
        reader->node = p_Var10;
        xVar11 = XML_TEXTREADER_START;
      }
      else {
        if ((xVar11 == XML_TEXTREADER_BACKTRACK) ||
           ((xVar6 = p_Var10->type, xVar6 < XML_XINCLUDE_END &&
            ((0x84020U >> (xVar6 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))) {
LAB_0019a719:
          p_Var12 = p_Var10->next;
          if (p_Var12 == (_xmlNode *)0x0) {
            p_Var12 = p_Var10->parent;
            xVar11 = XML_TEXTREADER_END;
            if (p_Var12 != (_xmlNode *)0x0) {
              if ((p_Var12->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE) {
LAB_0019a7cd:
                reader->state = XML_TEXTREADER_END;
                return 0;
              }
              reader->node = p_Var12;
              reader->depth = reader->depth + -1;
              p_Var10 = p_Var12;
              xVar11 = XML_TEXTREADER_BACKTRACK;
            }
            goto LAB_0019a769;
          }
          reader->node = p_Var12;
        }
        else {
          p_Var12 = p_Var10->children;
          if (p_Var12 == (_xmlNode *)0x0) {
            xVar11 = XML_TEXTREADER_BACKTRACK;
            if (xVar6 == XML_ATTRIBUTE_NODE) goto LAB_0019a769;
            goto LAB_0019a719;
          }
          reader->node = p_Var12;
          reader->depth = reader->depth + 1;
        }
        p_Var10 = p_Var12;
        xVar11 = XML_TEXTREADER_START;
      }
LAB_0019a769:
      reader->state = xVar11;
      if (1 < p_Var10->type - XML_XINCLUDE_START) {
        return 1;
      }
    } while( true );
  }
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  if (reader->mode != 0) {
    xVar11 = reader->state;
    iVar7 = reader->ctxt->nodeNr;
    pxVar8 = reader->node;
    local_40 = pxVar8;
    goto LAB_0019a882;
  }
  reader->mode = 1;
  do {
    iVar7 = xmlTextReaderPushData(reader);
    if (iVar7 < 0) goto LAB_0019a830;
    pxVar1 = reader->ctxt;
    if (pxVar1->node != (xmlNodePtr)0x0) {
      if (pxVar1->myDoc == (xmlDocPtr)0x0) {
        p_Var10 = reader->node;
      }
      else {
        p_Var10 = pxVar1->myDoc->children;
        reader->node = p_Var10;
      }
      if (p_Var10 == (_xmlNode *)0x0) {
        reader->node = *pxVar1->nodeTab;
      }
      goto LAB_0019a856;
    }
  } while ((reader->mode != 3) && (reader->state != XML_TEXTREADER_DONE));
  if (pxVar1->myDoc == (xmlDocPtr)0x0) {
    p_Var10 = reader->node;
  }
  else {
    p_Var10 = pxVar1->myDoc->children;
    reader->node = p_Var10;
  }
  if (p_Var10 == (_xmlNode *)0x0) {
LAB_0019a830:
    reader->mode = 2;
    reader->state = XML_TEXTREADER_ERROR;
    return -1;
  }
LAB_0019a856:
  reader->state = XML_TEXTREADER_ELEMENT;
  reader->depth = 0;
  pxVar1->parseMode = XML_PARSE_READER;
  xVar11 = XML_TEXTREADER_START;
  local_40 = (xmlNodePtr)0x0;
  iVar7 = 0;
LAB_0019ab20:
  do {
    pxVar8 = reader->node;
    if ((((pxVar8 != (xmlNodePtr)0x0) && (pxVar8->next == (_xmlNode *)0x0)) &&
        (pxVar8->type - XML_TEXT_NODE < 2)) &&
       (pxVar8 = xmlTextReaderExpand(reader), pxVar8 == (xmlNodePtr)0x0)) {
      return -1;
    }
    if ((reader->xinclude != 0) && (reader->in_xinclude == 0)) {
      pxVar8 = reader->node;
      if (pxVar8 != (xmlNodePtr)0x0) {
        if (((pxVar8->type == XML_ELEMENT_NODE) && (pxVar8->ns != (xmlNs *)0x0)) &&
           ((iVar4 = xmlStrEqual(pxVar8->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
            iVar4 != 0 ||
            (iVar4 = xmlStrEqual(reader->node->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"
                                ), iVar4 != 0)))) {
          if (reader->xincctxt == (xmlXIncludeCtxtPtr)0x0) {
            ctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
            reader->xincctxt = ctxt;
            xmlXIncludeSetFlags(ctxt,reader->parserFlags & 0xffff7fff);
          }
          pxVar8 = xmlTextReaderExpand(reader);
          if (pxVar8 == (xmlNodePtr)0x0) {
            return -1;
          }
          xmlXIncludeProcessNode(reader->xincctxt,reader->node);
        }
        goto LAB_0019ac0c;
      }
LAB_0019af2e:
      if (((reader->patternNr < 1) || (reader->state == XML_TEXTREADER_END)) ||
         (reader->state == XML_TEXTREADER_BACKTRACK)) goto LAB_0019af77;
      lVar14 = 0;
      break;
    }
LAB_0019ac0c:
    pxVar8 = reader->node;
    if (pxVar8 == (xmlNodePtr)0x0) goto LAB_0019af2e;
    xVar6 = pxVar8->type;
    if (xVar6 == XML_ENTITY_REF_NODE) {
      if (reader->ctxt != (xmlParserCtxtPtr)0x0) {
        if (reader->ctxt->replaceEntities == 1) {
          p_Var10 = pxVar8->children;
          if (((p_Var10 != (_xmlNode *)0x0) && (p_Var10->type == XML_ENTITY_DECL)) &&
             (p_Var10->children != (_xmlNode *)0x0)) {
            xmlTextReaderEntPush(reader,pxVar8);
            pxVar8 = reader->node->children->children;
            reader->node = pxVar8;
            if (pxVar8 == (xmlNodePtr)0x0) goto LAB_0019af2e;
          }
        }
        else if ((reader->ctxt != (xmlParserCtxtPtr)0x0) &&
                (pxVar13 = pxVar8, reader->validate != XML_TEXTREADER_NOT_VALIDATE)) {
LAB_0019acc0:
          xVar6 = pxVar13->type;
          if (xVar6 - XML_TEXT_NODE < 2) {
            pxVar2 = pxVar13->content;
            iVar4 = xmlStrlen(pxVar2);
            xmlTextReaderValidateCData(reader,pxVar2,iVar4);
LAB_0019ad39:
            pxVar9 = pxVar13->children;
            if (pxVar9 == (xmlNodePtr)0x0) {
              if (pxVar13->type == XML_ELEMENT_NODE) {
                xmlTextReaderValidatePop(reader);
              }
LAB_0019ad78:
              do {
                pxVar9 = pxVar13->next;
                if (pxVar9 != (xmlNodePtr)0x0) break;
                pxVar9 = pxVar13->parent;
                xVar6 = pxVar9->type;
                if (xVar6 == XML_ELEMENT_NODE) {
                  if (reader->entNr == 0) {
                    while ((pxVar13 = pxVar9->last, pxVar13 != (xmlNodePtr)0x0 &&
                           ((pxVar13->extra & 2) == 0))) {
                      xmlUnlinkNode(pxVar13);
                      xmlTextReaderFreeNode(reader,pxVar13);
                    }
                  }
                  reader->node = pxVar9;
                  xmlTextReaderValidatePop(reader);
                  xVar6 = pxVar9->type;
                }
                if (((xVar6 == XML_ENTITY_DECL) && (reader->ent != (xmlNodePtr)0x0)) &&
                   (reader->ent->children == pxVar9)) {
                  pxVar9 = xmlTextReaderEntPop(reader);
                }
                pxVar13 = pxVar9;
              } while (pxVar9 != pxVar8);
            }
LAB_0019ad43:
            if ((pxVar9 == (xmlNodePtr)0x0) || (pxVar13 = pxVar9, pxVar9 == pxVar8))
            goto LAB_0019aeac;
            goto LAB_0019acc0;
          }
          if (xVar6 == XML_ELEMENT_NODE) {
            reader->node = pxVar13;
            xmlTextReaderValidatePush(reader);
            goto LAB_0019ad39;
          }
          if (xVar6 != XML_ENTITY_REF_NODE) goto LAB_0019ad39;
          p_Var10 = pxVar13->children;
          if (((p_Var10 != (_xmlNode *)0x0) && (p_Var10->type == XML_ENTITY_DECL)) &&
             (p_Var10->children != (_xmlNode *)0x0)) {
            xmlTextReaderEntPush(reader,pxVar13);
            pxVar9 = pxVar13->children->children;
            goto LAB_0019ad43;
          }
          if (pxVar13 != pxVar8) goto LAB_0019ad78;
LAB_0019aeac:
          reader->node = pxVar8;
        }
      }
LAB_0019aeb0:
      if (((pxVar8->type != XML_ENTITY_DECL) || (reader->ent == (xmlNodePtr)0x0)) ||
         (reader->ent->children != pxVar8)) {
        if (reader->validate != XML_TEXTREADER_NOT_VALIDATE) {
          if (pxVar8->type == XML_ELEMENT_NODE) {
            if ((reader->state != XML_TEXTREADER_END) && (reader->state != XML_TEXTREADER_BACKTRACK)
               ) {
              xmlTextReaderValidatePush(reader);
            }
          }
          else if (pxVar8->type - XML_TEXT_NODE < 2) {
            pxVar2 = pxVar8->content;
            iVar7 = xmlStrlen(pxVar2);
            xmlTextReaderValidateCData(reader,pxVar2,iVar7);
          }
        }
        goto LAB_0019af2e;
      }
      pxVar8 = xmlTextReaderEntPop(reader);
      reader->node = pxVar8;
      reader->depth = reader->depth + 1;
LAB_0019a882:
      if (pxVar8 == (xmlNodePtr)0x0) {
        return -(uint)(reader->mode != 3);
      }
    }
    else {
      iVar4 = 1;
      if (xVar6 != XML_XINCLUDE_START) {
        if (xVar6 != XML_XINCLUDE_END) goto LAB_0019aeb0;
        iVar4 = -1;
      }
      reader->in_xinclude = reader->in_xinclude + iVar4;
    }
    while (pxVar8->next == (_xmlNode *)0x0) {
      pxVar1 = reader->ctxt;
      if (pxVar1->nodeNr != iVar7) {
LAB_0019a93c:
        if (xVar11 == XML_TEXTREADER_BACKTRACK) goto LAB_0019aa88;
        goto LAB_0019a952;
      }
      if (((xVar11 != XML_TEXTREADER_BACKTRACK) &&
          (p_Var10 = pxVar8->children, p_Var10 != (_xmlNode *)0x0)) &&
         (((xVar6 = pxVar8->type, xVar6 != XML_ENTITY_REF_NODE &&
           ((p_Var10->type != XML_TEXT_NODE || (p_Var10->next != (_xmlNode *)0x0)))) &&
          ((XML_DTD_NODE < xVar6 ||
           ((0x6200U >> (xVar6 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0))))))
      goto LAB_0019a95d;
      pxVar13 = pxVar1->node;
      if ((((pxVar13 != (xmlNodePtr)0x0) && (pxVar13 != pxVar8)) && (pxVar13 != pxVar8->parent)) ||
         (pxVar1->instate == XML_PARSER_EOF)) goto LAB_0019a93c;
      iVar4 = xmlTextReaderPushData(reader);
      if (iVar4 < 0) goto LAB_0019a830;
      pxVar8 = reader->node;
      if (pxVar8 == (xmlNodePtr)0x0) goto LAB_0019a922;
    }
    if (xVar11 == XML_TEXTREADER_BACKTRACK) {
LAB_0019a9a9:
      if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) && (pxVar8->type == XML_ELEMENT_NODE)) {
        xmlTextReaderValidatePop(reader);
        pxVar8 = reader->node;
      }
      iVar4 = reader->preserves;
      iVar5 = iVar4;
      if ((0 < iVar4) && (iVar5 = 1, (pxVar8->extra & 4) != 0)) {
        iVar5 = iVar4 + -1;
        reader->preserves = iVar5;
      }
      p_Var10 = pxVar8->next;
      reader->node = p_Var10;
      reader->state = XML_TEXTREADER_ELEMENT;
      if (((((iVar5 == 0) && (reader->in_xinclude == 0)) && (reader->entNr == 0)) &&
          ((pxVar8 = p_Var10->prev, pxVar8 != (xmlNodePtr)0x0 && (pxVar8->type != XML_DTD_NODE))))
         && ((pxVar8->extra & 2) == 0)) {
        if (local_40 == pxVar8) {
          local_40 = (xmlNodePtr)0x0;
        }
        xmlUnlinkNode(pxVar8);
        xmlTextReaderFreeNode(reader,pxVar8);
      }
      goto LAB_0019ab20;
    }
LAB_0019a952:
    p_Var10 = pxVar8->children;
    bVar3 = false;
    if (p_Var10 == (_xmlNode *)0x0) {
LAB_0019a97a:
      if (pxVar8->next == (_xmlNode *)0x0) {
        if (((xVar11 != XML_TEXTREADER_ELEMENT) || (pxVar8->type != XML_ELEMENT_NODE || bVar3)) ||
           ((pxVar8->extra & 1) != 0)) {
LAB_0019aa88:
          if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
             (pxVar8->type == XML_ELEMENT_NODE)) {
            xmlTextReaderValidatePop(reader);
            pxVar8 = reader->node;
          }
          iVar4 = reader->preserves;
          iVar5 = iVar4;
          if ((0 < iVar4) && (iVar5 = 1, (pxVar8->extra & 4) != 0)) {
            iVar5 = iVar4 + -1;
            reader->preserves = iVar5;
          }
          p_Var10 = pxVar8->parent;
          reader->node = p_Var10;
          if ((p_Var10 == (_xmlNode *)0x0) ||
             ((p_Var10->type < (XML_XINCLUDE_END|XML_ATTRIBUTE_NODE) &&
              ((0x202200U >> (p_Var10->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))) {
            if (reader->mode != 3) {
              iVar7 = xmlParseChunk(reader->ctxt,"",0,1);
              reader->state = XML_TEXTREADER_DONE;
              if (iVar7 != 0) {
                return -1;
              }
            }
            reader->node = (xmlNodePtr)0x0;
            reader->depth = -1;
            if ((((local_40 != (xmlNodePtr)0x0) && (reader->preserves == 0)) &&
                (reader->in_xinclude == 0)) &&
               (((reader->entNr == 0 && (local_40->type != XML_DTD_NODE)) &&
                ((local_40->extra & 2) == 0)))) {
              xmlUnlinkNode(local_40);
              xmlTextReaderFreeNode(reader,local_40);
            }
LAB_0019a922:
            reader->state = XML_TEXTREADER_DONE;
            return 0;
          }
          if (((iVar5 == 0) && (reader->in_xinclude == 0)) &&
             ((reader->entNr == 0 &&
              ((pxVar8 = p_Var10->last, pxVar8 != (xmlNodePtr)0x0 && ((pxVar8->extra & 2) == 0))))))
          {
            xmlUnlinkNode(pxVar8);
            xmlTextReaderFreeNode(reader,pxVar8);
          }
          reader->depth = reader->depth + -1;
          reader->state = XML_TEXTREADER_BACKTRACK;
          goto LAB_0019ab20;
        }
      }
      else if ((((xVar11 != XML_TEXTREADER_ELEMENT) || (pxVar8->type != XML_ELEMENT_NODE || bVar3))
               || ((pxVar8->extra & 1) != 0)) || (0 < reader->in_xinclude)) goto LAB_0019a9a9;
      reader->state = XML_TEXTREADER_END;
      xVar11 = XML_TEXTREADER_ELEMENT;
      goto LAB_0019ab20;
    }
LAB_0019a95d:
    if ((pxVar8->type < XML_XINCLUDE_END) &&
       (bVar3 = true, (0x84020U >> (pxVar8->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)
       ) goto LAB_0019a97a;
    reader->node = p_Var10;
    reader->depth = reader->depth + 1;
    reader->state = XML_TEXTREADER_ELEMENT;
  } while( true );
  while( true ) {
    iVar7 = xmlPatternMatch(reader->patternTab[lVar14],reader->node);
    lVar14 = lVar14 + 1;
    if (iVar7 == 1) break;
    if (reader->patternNr <= lVar14) goto LAB_0019af77;
  }
  xmlTextReaderPreserve(reader);
LAB_0019af77:
  if (((reader->validate == XML_TEXTREADER_VALIDATE_XSD) && (reader->xsdValidErrors == 0)) &&
     (reader->xsdValidCtxt != (xmlSchemaValidCtxtPtr)0x0)) {
    iVar7 = xmlSchemaIsValid(reader->xsdValidCtxt);
    reader->xsdValidErrors = (uint)(iVar7 == 0);
  }
  return 1;
}

Assistant:

int
xmlTextReaderRead(xmlTextReaderPtr reader) {
    int val, olddepth = 0;
    xmlTextReaderState oldstate = XML_TEXTREADER_START;
    xmlNodePtr oldnode = NULL;


    if (reader == NULL)
	return(-1);
    reader->curnode = NULL;
    if (reader->doc != NULL)
        return(xmlTextReaderReadTree(reader));
    if (reader->ctxt == NULL)
	return(-1);

#ifdef DEBUG_READER
    fprintf(stderr, "\nREAD ");
    DUMP_READER
#endif
    if (reader->mode == XML_TEXTREADER_MODE_INITIAL) {
	reader->mode = XML_TEXTREADER_MODE_INTERACTIVE;
	/*
	 * Initial state
	 */
	do {
	    val = xmlTextReaderPushData(reader);
		if (val < 0){
			reader->mode = XML_TEXTREADER_MODE_ERROR;
			reader->state = XML_TEXTREADER_ERROR;
		return(-1);
		}
	} while ((reader->ctxt->node == NULL) &&
		 ((reader->mode != XML_TEXTREADER_MODE_EOF) &&
		  (reader->state != XML_TEXTREADER_DONE)));
	if (reader->ctxt->node == NULL) {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL){
			reader->mode = XML_TEXTREADER_MODE_ERROR;
			reader->state = XML_TEXTREADER_ERROR;
		return(-1);
		}
	    reader->state = XML_TEXTREADER_ELEMENT;
	} else {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL)
		reader->node = reader->ctxt->nodeTab[0];
	    reader->state = XML_TEXTREADER_ELEMENT;
	}
	reader->depth = 0;
	reader->ctxt->parseMode = XML_PARSE_READER;
	goto node_found;
    }
    oldstate = reader->state;
    olddepth = reader->ctxt->nodeNr;
    oldnode = reader->node;

get_next_node:
    if (reader->node == NULL) {
	if (reader->mode == XML_TEXTREADER_MODE_EOF)
	    return(0);
	else
	    return(-1);
    }

    /*
     * If we are not backtracking on ancestors or examined nodes,
     * that the parser didn't finished or that we aren't at the end
     * of stream, continue processing.
     */
    while ((reader->node != NULL) && (reader->node->next == NULL) &&
	   (reader->ctxt->nodeNr == olddepth) &&
           ((oldstate == XML_TEXTREADER_BACKTRACK) ||
            (reader->node->children == NULL) ||
	    (reader->node->type == XML_ENTITY_REF_NODE) ||
	    ((reader->node->children != NULL) &&
	     (reader->node->children->type == XML_TEXT_NODE) &&
	     (reader->node->children->next == NULL)) ||
	    (reader->node->type == XML_DTD_NODE) ||
	    (reader->node->type == XML_DOCUMENT_NODE) ||
	    (reader->node->type == XML_HTML_DOCUMENT_NODE)) &&
	   ((reader->ctxt->node == NULL) ||
	    (reader->ctxt->node == reader->node) ||
	    (reader->ctxt->node == reader->node->parent)) &&
	   (reader->ctxt->instate != XML_PARSER_EOF)) {
	val = xmlTextReaderPushData(reader);
	if (val < 0){
		reader->mode = XML_TEXTREADER_MODE_ERROR;
		reader->state = XML_TEXTREADER_ERROR;
	    return(-1);
	}
	if (reader->node == NULL)
	    goto node_end;
    }
    if (oldstate != XML_TEXTREADER_BACKTRACK) {
	if ((reader->node->children != NULL) &&
	    (reader->node->type != XML_ENTITY_REF_NODE) &&
	    (reader->node->type != XML_XINCLUDE_START) &&
	    (reader->node->type != XML_DTD_NODE)) {
	    reader->node = reader->node->children;
	    reader->depth++;
	    reader->state = XML_TEXTREADER_ELEMENT;
	    goto node_found;
	}
    }
    if (reader->node->next != NULL) {
	if ((oldstate == XML_TEXTREADER_ELEMENT) &&
            (reader->node->type == XML_ELEMENT_NODE) &&
	    (reader->node->children == NULL) &&
	    ((reader->node->extra & NODE_IS_EMPTY) == 0)
#ifdef LIBXML_XINCLUDE_ENABLED
	    && (reader->in_xinclude <= 0)
#endif
	    ) {
	    reader->state = XML_TEXTREADER_END;
	    goto node_found;
	}
#ifdef LIBXML_REGEXP_ENABLED
	if ((reader->validate) &&
	    (reader->node->type == XML_ELEMENT_NODE))
	    xmlTextReaderValidatePop(reader);
#endif /* LIBXML_REGEXP_ENABLED */
        if ((reader->preserves > 0) &&
	    (reader->node->extra & NODE_IS_SPRESERVED))
	    reader->preserves--;
	reader->node = reader->node->next;
	reader->state = XML_TEXTREADER_ELEMENT;

	/*
	 * Cleanup of the old node
	 */
	if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (reader->node->prev != NULL) &&
            (reader->node->prev->type != XML_DTD_NODE)) {
	    xmlNodePtr tmp = reader->node->prev;
	    if ((tmp->extra & NODE_IS_PRESERVED) == 0) {
                if (oldnode == tmp)
                    oldnode = NULL;
		xmlUnlinkNode(tmp);
		xmlTextReaderFreeNode(reader, tmp);
	    }
	}

	goto node_found;
    }
    if ((oldstate == XML_TEXTREADER_ELEMENT) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->children == NULL) &&
	((reader->node->extra & NODE_IS_EMPTY) == 0)) {;
	reader->state = XML_TEXTREADER_END;
	goto node_found;
    }
#ifdef LIBXML_REGEXP_ENABLED
    if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) && (reader->node->type == XML_ELEMENT_NODE))
	xmlTextReaderValidatePop(reader);
#endif /* LIBXML_REGEXP_ENABLED */
    if ((reader->preserves > 0) &&
	(reader->node->extra & NODE_IS_SPRESERVED))
	reader->preserves--;
    reader->node = reader->node->parent;
    if ((reader->node == NULL) ||
	(reader->node->type == XML_DOCUMENT_NODE) ||
#ifdef LIBXML_DOCB_ENABLED
	(reader->node->type == XML_DOCB_DOCUMENT_NODE) ||
#endif
	(reader->node->type == XML_HTML_DOCUMENT_NODE)) {
	if (reader->mode != XML_TEXTREADER_MODE_EOF) {
	    val = xmlParseChunk(reader->ctxt, "", 0, 1);
	    reader->state = XML_TEXTREADER_DONE;
	    if (val != 0)
	        return(-1);
	}
	reader->node = NULL;
	reader->depth = -1;

	/*
	 * Cleanup of the old node
	 */
	if ((oldnode != NULL) && (reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (oldnode->type != XML_DTD_NODE) &&
	    ((oldnode->extra & NODE_IS_PRESERVED) == 0)) {
	    xmlUnlinkNode(oldnode);
	    xmlTextReaderFreeNode(reader, oldnode);
	}

	goto node_end;
    }
    if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
        (reader->in_xinclude == 0) &&
#endif
	(reader->entNr == 0) &&
        (reader->node->last != NULL) &&
        ((reader->node->last->extra & NODE_IS_PRESERVED) == 0)) {
	xmlNodePtr tmp = reader->node->last;
	xmlUnlinkNode(tmp);
	xmlTextReaderFreeNode(reader, tmp);
    }
    reader->depth--;
    reader->state = XML_TEXTREADER_BACKTRACK;

node_found:
    DUMP_READER

    /*
     * If we are in the middle of a piece of CDATA make sure it's finished
     */
    if ((reader->node != NULL) &&
        (reader->node->next == NULL) &&
        ((reader->node->type == XML_TEXT_NODE) ||
	 (reader->node->type == XML_CDATA_SECTION_NODE))) {
            if (xmlTextReaderExpand(reader) == NULL)
	        return -1;
    }

#ifdef LIBXML_XINCLUDE_ENABLED
    /*
     * Handle XInclude if asked for
     */
    if ((reader->xinclude) && (reader->in_xinclude == 0) &&
        (reader->node != NULL) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->ns != NULL) &&
	((xmlStrEqual(reader->node->ns->href, XINCLUDE_NS)) ||
	 (xmlStrEqual(reader->node->ns->href, XINCLUDE_OLD_NS)))) {
	if (reader->xincctxt == NULL) {
	    reader->xincctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
	    xmlXIncludeSetFlags(reader->xincctxt,
	                        reader->parserFlags & (~XML_PARSE_NOXINCNODE));
	}